

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> __thiscall
wasm::MultiMemoryLowering::memoryGrow(MultiMemoryLowering *this,Index memIdx,Name memoryName)

{
  Function *this_00;
  Builder *pBVar1;
  pointer pNVar2;
  uintptr_t uVar3;
  size_t sVar4;
  char *pcVar5;
  MultiMemoryLowering *pMVar6;
  Index index;
  BinaryOp BVar7;
  BinaryOp op;
  Call *value;
  LocalSet *pLVar8;
  Block *pBVar9;
  MemorySize *value_00;
  LocalGet *pLVar10;
  MemoryGrow *left;
  Const *pCVar11;
  Binary *pBVar12;
  Return *ifTrue;
  If *append;
  GlobalGet *pGVar13;
  GlobalGet *right;
  MemoryCopy *append_00;
  GlobalSet *append_01;
  ulong uVar14;
  undefined4 in_register_00000034;
  MultiMemoryLowering *this_01;
  Type TVar15;
  ulong uVar16;
  ulong uVar17;
  Name NVar18;
  Signature sig;
  Name name_00;
  Name name_01;
  optional<wasm::Type> type;
  Name name_02;
  Name name_03;
  undefined1 local_130 [8];
  Name memoryName_local;
  undefined1 local_118 [8];
  Name name;
  Name local_f8;
  Name local_e8;
  string local_d8;
  undefined1 local_b8 [8];
  anon_class_8_1_911e227b pageSizeConst;
  _Alloc_hider local_a0;
  anon_class_16_2_29deed5a getMoveSource;
  undefined1 auStack_88 [8];
  anon_class_24_3_04b167d9 getOffsetDelta;
  Block *local_58;
  Index local_44;
  Builder local_38;
  Builder builder;
  
  this_01 = (MultiMemoryLowering *)CONCAT44(in_register_00000034,memIdx);
  local_130 = memoryName.super_IString.str._M_str;
  uVar14 = memoryName.super_IString.str._M_len;
  local_38.wasm = this_01->wasm;
  IString::toString_abi_cxx11_(&local_d8,(IString *)local_130);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88,
                 &local_d8,"_grow");
  IString::IString((IString *)local_118,(string *)auStack_88);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::~string((string *)&local_d8);
  NVar18 = Names::getValidFunctionName(this_01->wasm,(Name)_local_118);
  TVar15.id = (this_01->pointerType).id;
  sig.results.id = TVar15.id;
  sig.params.id = TVar15.id;
  HeapType::HeapType((HeapType *)&memoryName_local.super_IString.str._M_str,sig);
  auStack_88 = (undefined1  [8])0x0;
  getOffsetDelta.builder = (Builder *)0x0;
  getOffsetDelta.this = (MultiMemoryLowering *)0x0;
  TVar15.id = (uintptr_t)auStack_88;
  name_01.super_IString.str._M_str = NVar18.super_IString.str._M_len;
  name_01.super_IString.str._M_len = (size_t)this;
  Builder::makeFunction
            (name_01,(HeapType)NVar18.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)
             memoryName_local.super_IString.str._M_str,(Expression *)TVar15.id);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_88);
  this_00 = (Function *)(this->super_Pass)._vptr_Pass;
  Name::Name((Name *)&name.super_IString.str._M_str,"page_delta");
  Function::setLocalName(this_00,0,(Name)stack0xfffffffffffffef8);
  local_b8 = (undefined1  [8])&local_38;
  getOffsetDelta.this = (MultiMemoryLowering *)local_b8;
  pBVar1 = (Builder *)(this->super_Pass)._vptr_Pass;
  local_a0._M_p = (pointer)local_b8;
  getMoveSource.builder = (Builder *)this_01;
  getMoveSource.this = this;
  auStack_88 = local_b8;
  getOffsetDelta.builder = (Builder *)this_01;
  Name::Name(&local_f8,"return_size");
  name_02.super_IString.str._M_str = (char *)(this_01->pointerType).id;
  name_02.super_IString.str._M_len = (size_t)local_f8.super_IString.str._M_str;
  index = Builder::addVar(pBVar1,(Function *)local_f8.super_IString.str._M_len,name_02,TVar15);
  uVar17 = uVar14 & 0xffffffff;
  pNVar2 = (this_01->memorySizeNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_d8._M_dataplus._M_p = (pointer)0x0;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_allocated_capacity = 0;
  TVar15.id = (this_01->pointerType).id;
  NVar18.super_IString.str._M_str = pNVar2[uVar17].super_IString.str._M_str;
  NVar18.super_IString.str._M_len = pNVar2[uVar17].super_IString.str._M_len;
  value = Builder::makeCall(&local_38,NVar18,
                            (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                            &local_d8,TVar15,false);
  pLVar8 = Builder::makeLocalSet(&local_38,index,(Expression *)value);
  pBVar9 = Builder::blockify(&local_38,(Expression *)pLVar8,(Expression *)0x0);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_d8);
  if ((long)(this_01->offsetGlobalNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this_01->offsetGlobalNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
            ._M_impl.super__Vector_impl_data._M_start >> 4 == uVar17) {
    local_44 = 0xffffffff;
  }
  else {
    pBVar1 = (Builder *)(this->super_Pass)._vptr_Pass;
    Name::Name(&local_e8,"memory_size");
    name_03.super_IString.str._M_str = (char *)(this_01->pointerType).id;
    name_03.super_IString.str._M_len = (size_t)local_e8.super_IString.str._M_str;
    local_44 = Builder::addVar(pBVar1,(Function *)local_e8.super_IString.str._M_len,name_03,TVar15);
    value_00 = Builder::makeMemorySize
                         (&local_38,(Name)(this_01->combinedMemory).super_IString.str,
                          this_01->memoryInfo);
    pLVar8 = Builder::makeLocalSet(&local_38,local_44,(Expression *)value_00);
    pBVar9 = Builder::blockify(&local_38,(Expression *)pBVar9,(Expression *)pLVar8);
  }
  uVar3 = (this_01->pointerType).id;
  pLVar10 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
  pLVar10->index = 0;
  (pLVar10->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar3;
  uVar16 = (ulong)this_01->memoryInfo;
  left = Builder::makeMemoryGrow
                   (&local_38,(Expression *)pLVar10,
                    (Name)(this_01->combinedMemory).super_IString.str,this_01->memoryInfo);
  pCVar11 = Builder::makeConst<int>(&local_38,-1);
  pBVar12 = Builder::makeBinary(&local_38,EqInt32,(Expression *)left,(Expression *)pCVar11);
  pCVar11 = Builder::makeConst<int>(&local_38,-1);
  ifTrue = MixedArena::alloc<wasm::Return>(&(local_38.wasm)->allocator);
  ifTrue->value = (Expression *)pCVar11;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar16;
  append = Builder::makeIf(&local_38,(Expression *)pBVar12,(Expression *)ifTrue,(Expression *)0x0,
                           type);
  local_58 = Builder::blockify(&local_38,(Expression *)pBVar9,(Expression *)append);
  if ((long)(this_01->offsetGlobalNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this_01->offsetGlobalNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
            ._M_impl.super__Vector_impl_data._M_start >> 4 != uVar17) {
    NVar18 = getOffsetGlobal(this_01,(int)memoryName.super_IString.str._M_len + 1);
    BVar7 = Abstract::getBinary((Type)(this_01->pointerType).id,Add);
    pGVar13 = memoryGrow::anon_class_16_2_29deed5a::operator()
                        ((anon_class_16_2_29deed5a *)&stack0xffffffffffffff60,NVar18);
    pBVar12 = memoryGrow::anon_class_24_3_04b167d9::operator()
                        ((anon_class_24_3_04b167d9 *)auStack_88);
    pageSizeConst.builder =
         (Builder *)Builder::makeBinary(&local_38,BVar7,(Expression *)pGVar13,(Expression *)pBVar12)
    ;
    pGVar13 = memoryGrow::anon_class_16_2_29deed5a::operator()
                        ((anon_class_16_2_29deed5a *)&stack0xffffffffffffff60,NVar18);
    BVar7 = Abstract::getBinary((Type)(this_01->pointerType).id,Sub);
    op = Abstract::getBinary((Type)(this_01->pointerType).id,Mul);
    uVar3 = (this_01->pointerType).id;
    pLVar10 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
    pLVar10->index = local_44;
    (pLVar10->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar3;
    pCVar11 = memoryGrow::anon_class_8_1_911e227b::operator()((anon_class_8_1_911e227b *)local_b8);
    pBVar12 = Builder::makeBinary(&local_38,op,(Expression *)pLVar10,(Expression *)pCVar11);
    right = memoryGrow::anon_class_16_2_29deed5a::operator()
                      ((anon_class_16_2_29deed5a *)&stack0xffffffffffffff60,NVar18);
    pBVar12 = Builder::makeBinary(&local_38,BVar7,(Expression *)pBVar12,(Expression *)right);
    append_00 = Builder::makeMemoryCopy
                          (&local_38,(Expression *)pageSizeConst.builder,(Expression *)pGVar13,
                           (Expression *)pBVar12,(Name)(this_01->combinedMemory).super_IString.str,
                           (Name)(this_01->combinedMemory).super_IString.str);
    local_58 = Builder::blockify(&local_38,(Expression *)local_58,(Expression *)append_00);
  }
  while( true ) {
    pMVar6 = getMoveSource.this;
    uVar17 = uVar14 & 0xffffffff;
    pNVar2 = (this_01->offsetGlobalNames).
             super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this_01->offsetGlobalNames).
                      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pNVar2 >> 4) <= uVar17) break;
    sVar4 = pNVar2[uVar17].super_IString.str._M_len;
    pcVar5 = pNVar2[uVar17].super_IString.str._M_str;
    BVar7 = Abstract::getBinary((Type)(this_01->pointerType).id,Add);
    pGVar13 = memoryGrow::anon_class_16_2_29deed5a::operator()
                        ((anon_class_16_2_29deed5a *)&stack0xffffffffffffff60,
                         (Name)pNVar2[uVar17].super_IString.str);
    pBVar12 = memoryGrow::anon_class_24_3_04b167d9::operator()
                        ((anon_class_24_3_04b167d9 *)auStack_88);
    pBVar12 = Builder::makeBinary(&local_38,BVar7,(Expression *)pGVar13,(Expression *)pBVar12);
    name_00.super_IString.str._M_str = pcVar5;
    name_00.super_IString.str._M_len = sVar4;
    append_01 = Builder::makeGlobalSet(&local_38,name_00,(Expression *)pBVar12);
    local_58 = Builder::blockify(&local_38,(Expression *)local_58,(Expression *)append_01);
    uVar14 = (ulong)((int)uVar14 + 1);
  }
  uVar3 = (this_01->pointerType).id;
  pLVar10 = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
  pLVar10->index = index;
  (pLVar10->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar3;
  pBVar9 = Builder::blockify(&local_38,(Expression *)local_58,(Expression *)pLVar10);
  (pMVar6->super_Pass)._vptr_Pass[0xc] = (_func_int *)pBVar9;
  return (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)pMVar6;
}

Assistant:

std::unique_ptr<Function> memoryGrow(Index memIdx, Name memoryName) {
    Builder builder(*wasm);
    Name name = memoryName.toString() + "_grow";
    Name functionName = Names::getValidFunctionName(*wasm, name);
    auto function = Builder::makeFunction(
      functionName, Signature(pointerType, pointerType), {});
    function->setLocalName(0, "page_delta");
    auto pageSizeConst = [&]() {
      return builder.makeConst(Literal(Memory::kPageSize));
    };
    auto getOffsetDelta = [&]() {
      return builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Mul),
                                builder.makeLocalGet(0, pointerType),
                                pageSizeConst());
    };
    auto getMoveSource = [&](Name global) {
      return builder.makeGlobalGet(global, pointerType);
    };
    Expression* functionBody;
    Index sizeLocal = -1;

    Index returnLocal =
      Builder::addVar(function.get(), "return_size", pointerType);
    functionBody = builder.blockify(builder.makeLocalSet(
      returnLocal, builder.makeCall(memorySizeNames[memIdx], {}, pointerType)));

    if (!isLastMemory(memIdx)) {
      sizeLocal = Builder::addVar(function.get(), "memory_size", pointerType);
      functionBody = builder.blockify(
        functionBody,
        builder.makeLocalSet(
          sizeLocal, builder.makeMemorySize(combinedMemory, memoryInfo)));
    }

    // Attempt to grow the combinedMemory. If -1 returns, enough memory could
    // not be allocated, so return -1.
    functionBody = builder.blockify(
      functionBody,
      builder.makeIf(
        builder.makeBinary(
          EqInt32,
          builder.makeMemoryGrow(
            builder.makeLocalGet(0, pointerType), combinedMemory, memoryInfo),
          builder.makeConst(-1)),
        builder.makeReturn(builder.makeConst(-1))));

    // If we are not growing the last memory, then we need to copy data,
    // shifting it over to accomodate the increase from page_delta
    if (!isLastMemory(memIdx)) {
      // This offset is the starting pt for copying
      auto offsetGlobalName = getOffsetGlobal(memIdx + 1);
      functionBody = builder.blockify(
        functionBody,
        builder.makeMemoryCopy(
          // destination
          builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Add),
                             getMoveSource(offsetGlobalName),
                             getOffsetDelta()),
          // source
          getMoveSource(offsetGlobalName),
          // size
          builder.makeBinary(
            Abstract::getBinary(pointerType, Abstract::Sub),
            builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Mul),
                               builder.makeLocalGet(sizeLocal, pointerType),
                               pageSizeConst()),
            getMoveSource(offsetGlobalName)),
          combinedMemory,
          combinedMemory));
    }

    // Adjust the offsets of the globals impacted by the memory.grow call
    for (Index i = memIdx; i < offsetGlobalNames.size(); i++) {
      auto& offsetGlobalName = offsetGlobalNames[i];
      functionBody = builder.blockify(
        functionBody,
        builder.makeGlobalSet(
          offsetGlobalName,
          builder.makeBinary(Abstract::getBinary(pointerType, Abstract::Add),
                             getMoveSource(offsetGlobalName),
                             getOffsetDelta())));
    }

    functionBody = builder.blockify(
      functionBody, builder.makeLocalGet(returnLocal, pointerType));

    function->body = functionBody;
    return function;
  }